

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)

{
  SQArray *this;
  SQObjectPtr *idx_00;
  bool bVar1;
  SQInteger SVar2;
  SQObject *val;
  HSQUIRRELVM local_50;
  SQRESULT ret;
  SQObjectPtr *arr;
  SQInteger destpos_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  arr = (SQObjectPtr *)destpos;
  destpos_local = idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 1) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,destpos_local,OT_ARRAY,(SQObjectPtr **)&ret);
    idx_00 = arr;
    if (bVar1) {
      this = *(SQArray **)(ret + 8);
      val = &SQVM::GetUp((SQVM *)idx_local,-1)->super_SQObject;
      bVar1 = SQArray::Insert(this,(SQInteger)idx_00,val);
      if (bVar1) {
        local_50 = (HSQUIRRELVM)0x0;
      }
      else {
        local_50 = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"index out of range");
      }
      SQVM::Pop((SQVM *)idx_local);
      v_local = local_50;
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    SQRESULT ret = _array(*arr)->Insert(destpos, v->GetUp(-1)) ? SQ_OK : sq_throwerror(v,_SC("index out of range"));
    v->Pop();
    return ret;
}